

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldKr83m
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double maxTimeSeparation,double minTimeSeparation)

{
  bool bVar1;
  runtime_error *this_00;
  RandomGen *this_01;
  double dVar2;
  double dVar3;
  Wvalue WVar4;
  double Ne_32;
  double Nph_32;
  double Nph_15;
  double Nph_09;
  double Nph_76;
  double Ne_30;
  double Nph_30;
  double local_1f0;
  double Ne_18;
  double Nph_18;
  double local_1b0;
  double Ne_12;
  double Nph_12;
  double local_170;
  double Ne_10;
  double Nph_10;
  double local_130;
  double Ne_2;
  double Nph_2;
  double local_f0;
  double Ne_9;
  double Nph_9;
  double a3;
  double a2;
  double a1;
  double Nq_9;
  double deltaT_ns;
  YieldResult result;
  double deltaT_ns_halflife;
  double alpha;
  double Wq_eV;
  Wvalue wvalue;
  double Ne;
  double Nph;
  double Nq;
  double minTimeSeparation_local;
  double maxTimeSeparation_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  if ((maxTimeSeparation < minTimeSeparation) && ((energy < 32.0 || (32.2 <= energy)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ERROR: min greater than max");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar2 = VDetector::get_molarMass(this->fdetector);
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  WVar4 = WorkFunction(density,dVar2,bVar1);
  Wq_eV = WVar4.Wq_eV;
  result.DeltaT_Scint = 154.4;
  memset(&deltaT_ns,0,0x30);
  Nq_9 = -999.0;
  bVar1 = ValidityTests::nearlyEqual(minTimeSeparation,maxTimeSeparation,1e-09);
  dVar2 = maxTimeSeparation;
  if (!bVar1) {
    dVar2 = Nq_9;
  }
  Nq_9 = dVar2;
  bVar1 = ValidityTests::nearlyEqual(minTimeSeparation,maxTimeSeparation,1e-09);
  if (!bVar1) {
    this_01 = RandomGen::rndm();
    Nq_9 = RandomGen::rand_exponential(this_01,154.4,minTimeSeparation,maxTimeSeparation);
  }
  a1 = 9400.0 / Wq_eV;
  a2 = -19.575;
  a3 = 0.0005823;
  dVar2 = pow(Nq_9,2.0);
  Nph_9 = 300000.0 / dVar2 + 69.986;
  if (87.0 < Nph_9) {
    Nph_9 = 87.0;
  }
  dVar2 = a2 * a3;
  dVar3 = log(1.0 / (a3 * dfield) + 1.0);
  Ne_9 = (dVar2 * dfield * dVar3 + Nph_9) * 9.4;
  local_f0 = a1 - Ne_9;
  if (local_f0 < 0.0) {
    local_f0 = 0.0;
  }
  (*this->_vptr_NESTcalc[2])(0x4000000000000000,density,dfield,0x3ff0000000000000,&Nph_2);
  memcpy(&deltaT_ns,&Nph_2,0x30);
  Ne_2 = deltaT_ns;
  local_130 = result.PhotonYield;
  (*this->_vptr_NESTcalc[2])(0x4024000000000000,density,dfield,0x3ff0000000000000,&Nph_10);
  memcpy(&deltaT_ns,&Nph_10,0x30);
  Ne_10 = deltaT_ns;
  local_170 = result.PhotonYield;
  (*this->_vptr_NESTcalc[2])(0x4028000000000000,density,dfield,0x3ff0000000000000,&Nph_12);
  memcpy(&deltaT_ns,&Nph_12,0x30);
  Ne_12 = deltaT_ns;
  local_1b0 = result.PhotonYield;
  (*this->_vptr_NESTcalc[2])(0x4032000000000000,density,dfield,0x3ff0000000000000,&Nph_18);
  memcpy(&deltaT_ns,&Nph_18,0x30);
  Ne_18 = deltaT_ns;
  local_1f0 = result.PhotonYield;
  (*this->_vptr_NESTcalc[2])(0x403e000000000000,density,dfield,0x3ff0000000000000,&Nph_30);
  memcpy(&deltaT_ns,&Nph_30,0x30);
  Ne = (Ne_18 + Ne_10 + Ne_2 + Ne_2) * 0.09 +
       (deltaT_ns + Ne_2) * 0.76 + (Ne_18 + Ne_12 + Ne_2) * 0.15;
  wvalue.alpha = 32000.0 / Wq_eV - Ne;
  if ((energy <= 9.35) || (9.45 <= energy)) {
    if ((energy < 32.0) || (32.2 <= energy)) {
      wvalue.alpha = local_f0 + wvalue.alpha;
      Ne = Ne_9 + Ne;
    }
  }
  else {
    Ne = Ne_9;
    wvalue.alpha = local_f0;
  }
  deltaT_ns = Ne;
  result.PhotonYield = wvalue.alpha;
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  if (!bVar1) {
    deltaT_ns = (deltaT_ns + result.PhotonYield) - wvalue.alpha * 1.08;
    result.PhotonYield = wvalue.alpha * 1.08;
  }
  (*this->_vptr_NESTcalc[0x11])(energy,density);
  result.ExcitonRatio = 1.0;
  result.ElectricField = Nq_9;
  result.Lindhard = dfield;
  (*this->_vptr_NESTcalc[0xb])(energy,Wq_eV,__return_storage_ptr__,this,&deltaT_ns);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldKr83m(double energy, double density,
                                    double dfield, double maxTimeSeparation,
                                    double minTimeSeparation) {
  if (minTimeSeparation > maxTimeSeparation &&
      (energy < 32.0 || energy >= 32.2))
    throw std::runtime_error("ERROR: min greater than max");

  double Nq = -999;
  double Nph = -999;
  double Ne = -999;
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;
  constexpr double deltaT_ns_halflife = 154.4;
  YieldResult result{};
  double deltaT_ns = -999.;
  if (ValidityTests::nearlyEqual(minTimeSeparation, maxTimeSeparation))
    deltaT_ns = maxTimeSeparation;
  /*if (minTimeSeparation < 100. && energy < 32. &&
      kr83m_reported_low_deltaT == false) {
    kr83m_reported_low_deltaT = true;
    cerr << "\tWARNING! Outside of Kr83m model fit validity region. Details:"
         << " minTimeSeparation is < 100 ns and your input E is 9.4 keV."
         << " Data for separated Kr83m decays do not yet exist for deltaT_ns "
            "<100 ns."
         << " 9.4 & 32.1 keV yields are still summed to physically accurate "
            "result, but individually will be nonsensical."
         << endl;
  }*/

  if (!ValidityTests::nearlyEqual(minTimeSeparation, maxTimeSeparation))
    deltaT_ns = RandomGen::rndm()->rand_exponential(
        deltaT_ns_halflife, minTimeSeparation, maxTimeSeparation);
  double Nq_9 = 9.4e3 / Wq_eV;  // 9.4 keV model
  double a1 = -19.575;          //-11.839 + 78.063 / deltaT_ns;
  if (a1 > 0.) a1 = 0.;
  double a2 = 5.823e-4;  //(0.0015796*deltaT_ns)/(11.55+deltaT_ns);
  double a3 = 69.986 + 3e5 / pow(deltaT_ns, 2.);  // 2.7745e5 and 2
  if (a3 > 87.) a3 = 87.;
  double Nph_9 = 9.4 * (a1 * a2 * dfield * log(1. + 1. / (a2 * dfield)) + a3);
  double Ne_9 = Nq_9 - Nph_9;
  if (Ne_9 < 0.) Ne_9 = 0.;  // can't have negative charge, from either decay
  result = GetYieldGamma(2., density, dfield);
  double Nph_2 = result.PhotonYield;
  double Ne_2 = result.ElectronYield;
  result = GetYieldGamma(10., density, dfield);
  double Nph_10 = result.PhotonYield;
  double Ne_10 = result.ElectronYield;
  result = GetYieldGamma(12., density, dfield);
  double Nph_12 = result.PhotonYield;
  double Ne_12 = result.ElectronYield;
  result = GetYieldGamma(18., density, dfield);
  double Nph_18 = result.PhotonYield;
  double Ne_18 = result.ElectronYield;
  result = GetYieldGamma(30., density, dfield);
  double Nph_30 = result.PhotonYield;
  double Ne_30 = result.ElectronYield;
  double Nph_76 = Nph_30 + Nph_2;
  double Nph_09 = Nph_18 + Nph_10 + Nph_2 + Nph_2;
  double Nph_15 = Nph_18 + Nph_12 + Nph_2;
  // now, add up the 32.1 keV yields
  double Nph_32 = 0.76 * Nph_76 + 0.15 * Nph_15 + 0.09 * Nph_09;
  double Ne_32 = 32e3 / Wq_eV - Nph_32;
  if (energy > 9.35 && energy < 9.45) {
    alpha = 0.;
    Nph = Nph_9;
    Ne = Ne_9;
  } else if (energy >= 32.0 && energy < 32.2) {
    Nph = Nph_32;
    Ne = Ne_32;
  } else {  // merged 41.5 keV decay
    Ne = Ne_9 + Ne_32;
    Nph = Nph_9 + Nph_32;
  }

  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  if (!fdetector->get_OldW13eV()) {
    Ne *= ZurichEXOQ;
    Nph = (result.PhotonYield + result.ElectronYield) - Ne;
    result.PhotonYield = Nph;
    result.ElectronYield = Ne;
  }
  result.ExcitonRatio = NexONi(energy, density);
  result.Lindhard = 1;
  result.ElectricField = dfield;
  result.DeltaT_Scint = deltaT_ns;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}